

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this)

{
  int con_index;
  int num_linear_terms;
  LinearConHandler LVar1;
  LinearPartHandler linear_expr;
  
  con_index = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
              ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                        *)this,*(uint *)(*(long *)(this + 8) + 4));
  num_linear_terms =
       NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::ReadUInt
                 ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                   *)this,1,**(int **)(this + 8) + 1);
  LVar1 = ExprPrinter::OnLinearConExpr(*(ExprPrinter **)(this + 0x10),con_index,num_linear_terms);
  linear_expr._8_8_ = LVar1._8_8_ & 0xffffffffff;
  linear_expr.num_terms = (int)LVar1._0_8_;
  linear_expr.nonlinear_expr_id = (int)((ulong)LVar1._0_8_ >> 0x20);
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
  ReadLinearExpr<ExprPrinter::LinearPartHandler>
            ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)
             this,num_linear_terms,linear_expr);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}